

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsort_impl.h
# Opt level: O0

void secp256k1_heap_swap(uchar *arr,size_t i,size_t j,size_t stride)

{
  ulong in_RCX;
  size_t len;
  uchar *b;
  uchar *a;
  undefined8 local_38;
  
  for (local_38 = in_RCX; 0x40 < local_38; local_38 = local_38 - 0x40) {
    secp256k1_heap_swap64(a,b,len);
  }
  secp256k1_heap_swap64(a,b,len);
  return;
}

Assistant:

static SECP256K1_INLINE void secp256k1_heap_swap(unsigned char *arr, size_t i, size_t j, size_t stride) {
    unsigned char *a = arr + i*stride;
    unsigned char *b = arr + j*stride;
    size_t len = stride;
    while (64 < len) {
        secp256k1_heap_swap64(a + (len - 64), b + (len - 64), 64);
        len -= 64;
    }
    secp256k1_heap_swap64(a, b, len);
}